

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

void __thiscall
Catch::MessageBuilder::MessageBuilder
          (MessageBuilder *this,StringRef *macroName,SourceLineInfo *lineInfo,OfType type)

{
  OfType type_local;
  SourceLineInfo *lineInfo_local;
  StringRef *macroName_local;
  MessageBuilder *this_local;
  
  MessageStream::MessageStream(&this->super_MessageStream);
  MessageInfo::MessageInfo(&this->m_info,macroName,lineInfo,type);
  return;
}

Assistant:

Catch::MessageBuilder::MessageBuilder( StringRef const& macroName,
                                           SourceLineInfo const& lineInfo,
                                           ResultWas::OfType type )
        :m_info(macroName, lineInfo, type) {}